

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::HexStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (HexStrOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  idx_t i;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  undefined1 auVar5 [16];
  string_t target;
  anon_union_16_2_67f50693_for_value local_30;
  undefined8 local_20;
  long local_18;
  
  local_18 = input.value._0_8_;
  lVar4 = local_18;
  if ((uint)this < 0xd) {
    lVar4 = (long)&local_20 + 4;
  }
  local_20 = this;
  auVar5 = duckdb::StringVector::EmptyString(input.value._8_8_,((ulong)this & 0xffffffff) * 2);
  local_30.pointer.ptr = (char *)auVar5._8_8_;
  local_30._0_8_ = auVar5._0_8_;
  pcVar3 = local_30.pointer.ptr;
  if (auVar5._0_4_ < 0xd) {
    pcVar3 = local_30.pointer.prefix;
  }
  for (uVar2 = 0; ((ulong)this & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
    pcVar3[uVar2 * 2] = "0123456789ABCDEF"[*(byte *)(lVar4 + uVar2) >> 4];
    pcVar3[uVar2 * 2 + 1] = "0123456789ABCDEF"[*(byte *)(lVar4 + uVar2) & 0xf];
  }
  string_t::Finalize((string_t *)&local_30.pointer);
  aVar1.pointer.ptr = local_30.pointer.ptr;
  aVar1._0_8_ = local_30._0_8_;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 2);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			*output = Blob::HEX_TABLE[(data[i] >> 4) & 0x0F];
			output++;
			*output = Blob::HEX_TABLE[data[i] & 0x0F];
			output++;
		}

		target.Finalize();
		return target;
	}